

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O3

void __thiscall OpenMD::DumpReader::readSet(DumpReader *this,int whichFrame)

{
  ifstream *inputStream;
  char *__s;
  pointer pfVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  string line;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = (char *)0x0;
  local_40 = 0;
  inputStream = &this->inFile_;
  std::ios::clear((int)*(undefined8 *)(*(long *)&this->inFile_ + -0x18) + (int)inputStream);
  pfVar1 = (this->framePos_).
           super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::istream::seekg(inputStream,pfVar1[whichFrame]._M_off,pfVar1[whichFrame]._M_state);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->inFile_ + -0x18) + (char)inputStream);
  __s = this->buffer;
  std::istream::getline((char *)inputStream,(long)__s,'\0');
  pcVar2 = local_48;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar2,(ulong)__s);
  lVar4 = std::__cxx11::string::find((char *)&local_50,0x2c6d8e,0);
  if (lVar4 == -1) {
    builtin_strncpy(painCave.errMsg + 0x20,"Snapshot>\n",0xb);
    builtin_strncpy(painCave.errMsg + 0x10,": can not find <",0x10);
    builtin_strncpy(painCave.errMsg,"DumpReader Error",0x10);
    painCave.isFatal = 1;
    simError();
  }
  readFrameProperties(this,(istream *)inputStream);
  uVar3 = readStuntDoubles(this,(istream *)inputStream);
  std::ios::widen((char)*(undefined8 *)(*(long *)&inputStream->field_0x0 + -0x18) +
                  (char)inputStream);
  std::istream::getline((char *)inputStream,(long)__s,'\0');
  pcVar2 = local_48;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar2,(ulong)__s);
  lVar4 = std::__cxx11::string::find((char *)&local_50,0x2c6eea,0);
  if (lVar4 == -1) {
    lVar4 = std::__cxx11::string::find((char *)&local_50,0x2c6dd5,0);
    if (lVar4 == -1) {
      builtin_strncpy(painCave.errMsg + 0x20,"/Snapshot>\n",0xc);
      builtin_strncpy(painCave.errMsg + 0x10,": can not find <",0x10);
      builtin_strncpy(painCave.errMsg,"DumpReader Error",0x10);
      painCave.isFatal = 1;
      simError();
    }
  }
  else {
    readSiteData(this,(istream *)inputStream);
  }
  if (uVar3 != this->info_->nGlobalIntegrableObjects_) {
    snprintf(painCave.errMsg,2000,
             "DumpReader Error: Number of parsed StuntDouble lines (%d)\n\tis not the same as the expected number of Objects (%d)\n"
             ,(ulong)uVar3);
    painCave.isFatal = 1;
    simError();
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void DumpReader::readSet(int whichFrame) {
    std::string line;

#ifndef IS_MPI
    inFile_.clear();
    inFile_.seekg(framePos_[whichFrame]);

    std::istream& inputStream = inFile_;
#else

    int primaryNode = 0;
    std::stringstream sstream;
    if (worldRank == primaryNode) {
      std::string sendBuffer;

      inFile_.clear();
      inFile_.seekg(framePos_[whichFrame]);

      while (inFile_.getline(buffer, bufferSize)) {
        line = buffer;
        sendBuffer += line;
        sendBuffer += '\n';
        if (line.find("</Snapshot>") != std::string::npos) { break; }
      }

      int sendBufferSize = sendBuffer.size();
      MPI_Bcast(&sendBufferSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
      MPI_Bcast((void*)sendBuffer.c_str(), sendBufferSize, MPI_CHAR,
                primaryNode, MPI_COMM_WORLD);

      sstream.str(sendBuffer);
    } else {
      int sendBufferSize;
      MPI_Bcast(&sendBufferSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
      char* recvBuffer = new char[sendBufferSize + 1];
      assert(recvBuffer);
      recvBuffer[sendBufferSize] = '\0';
      MPI_Bcast(recvBuffer, sendBufferSize, MPI_CHAR, primaryNode,
                MPI_COMM_WORLD);
      sstream.str(recvBuffer);
      delete[] recvBuffer;
    }

    std::istream& inputStream = sstream;
#endif

    inputStream.getline(buffer, bufferSize);

    line = buffer;
    if (line.find("<Snapshot>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: can not find <Snapshot>\n");
      painCave.isFatal = 1;
      simError();
    }

    // read frameData
    readFrameProperties(inputStream);

    // read StuntDoubles
    int nSD = readStuntDoubles(inputStream);

    inputStream.getline(buffer, bufferSize);
    line = buffer;

    if (line.find("<SiteData>") != std::string::npos) {
      // read SiteData
      readSiteData(inputStream);
    } else {
      if (line.find("</Snapshot>") == std::string::npos) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: can not find </Snapshot>\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    if (nSD != info_->getNGlobalIntegrableObjects()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Number of parsed StuntDouble lines (%d)\n"
               "\tis not the same as the expected number of Objects (%d)\n",
               nSD, info_->getNGlobalIntegrableObjects());
      painCave.isFatal = 1;
      simError();
    }
  }